

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O1

bool __thiscall
QSslConfiguration::addCaCertificates
          (QSslConfiguration *this,QString *path,EncodingFormat format,PatternSyntax syntax)

{
  QSslConfigurationPrivate *pQVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QSslCertificate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslCertificate::fromPath((QList<QSslCertificate> *)&local_38,path,format,syntax);
  qVar2 = local_38.size;
  if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
    pQVar1 = (this->d).d.ptr;
    if ((pQVar1 != (QSslConfigurationPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QSslConfigurationPrivate>::detach_helper(&this->d);
    }
    QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
              ((QCommonArrayOps<QSslCertificate> *)&((this->d).d.ptr)->caCertificates,local_38.ptr,
               local_38.ptr + local_38.size);
  }
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (undefined1 *)qVar2 != (undefined1 *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslConfiguration::addCaCertificates(const QString &path, QSsl::EncodingFormat format,
                                          QSslCertificate::PatternSyntax syntax)
{
    QList<QSslCertificate> certs = QSslCertificate::fromPath(path, format, syntax);
    if (certs.isEmpty())
        return false;

    d->caCertificates += certs;
    return true;
}